

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

int hugeRead(void *context,char *buffer,int len)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  
  pcVar1 = current;
  iVar3 = rlen;
  if (len < 0 || (buffer == (char *)0x0 || context == (void *)0x0)) {
    return -1;
  }
  if (instate == 2) {
    iVar5 = rlen - len;
    if (iVar5 == 0 || rlen < len) {
      sVar4 = (size_t)rlen;
      rlen = 0;
      memcpy(buffer,current,sVar4);
      curlen = 0;
      instate = 3;
      return iVar3;
    }
  }
  else {
    if (instate == 1) {
      uVar2 = 0x1000;
      if ((uint)len < 0x1000) {
        uVar2 = len;
      }
      memcpy(buffer,filling,(ulong)uVar2);
      curlen = curlen + uVar2;
      if (curlen < maxlen) {
        if (curlen <= dotlen) {
          return uVar2;
        }
        fputc(0x2e,_stderr);
        dotlen = dotlen + maxlen / 10;
        return uVar2;
      }
      pcVar1 = hugeTests[currentTest].end;
      sVar4 = strlen(pcVar1);
      rlen = (int)sVar4;
      current = pcVar1;
      instate = 2;
      return uVar2;
    }
    if (instate != 0) {
      return 0;
    }
    iVar5 = rlen - len;
    if (iVar5 == 0 || rlen < len) {
      sVar4 = (size_t)rlen;
      rlen = 0;
      memcpy(buffer,current,sVar4);
      curlen = 0;
      dotlen = maxlen / 10;
      instate = 1;
      return iVar3;
    }
  }
  memcpy(buffer,current,(ulong)(uint)len);
  current = pcVar1 + (uint)len;
  rlen = iVar5;
  return len;
}

Assistant:

static int
hugeRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if (instate == 0) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 1;
            curlen = 0;
            dotlen = maxlen / 10;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 2) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 3;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 1) {
        if (len > CHUNK) len = CHUNK;
        memcpy(buffer, &filling[0], len);
        curlen += len;
        if (curlen >= maxlen) {
            rlen = strlen(hugeTests[currentTest].end);
            current = hugeTests[currentTest].end;
            instate = 2;
	} else {
            if (curlen > dotlen) {
                fprintf(stderr, ".");
                dotlen += maxlen / 10;
            }
        }
    } else
      len = 0;
    return (len);
}